

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

void __thiscall IGameController::CheckTeamBalance(IGameController *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CConfig *pCVar4;
  IServer *this_00;
  CGameContext *this_01;
  IConsole *pIVar5;
  IGameController *in_RDI;
  long in_FS_OFFSET;
  char aBuf [256];
  char local_108 [160];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsTeamplay(in_RDI);
  if ((bVar2) && (pCVar4 = Config(in_RDI), pCVar4->m_SvTeambalanceTime != 0)) {
    iVar3 = absolute<int>(in_RDI->m_aTeamSize[0] - in_RDI->m_aTeamSize[1]);
    if (iVar3 < 2) {
      str_format(local_108,0x100,"Teams are balanced (red=%d blue=%d)",
                 (ulong)(uint)in_RDI->m_aTeamSize[0],(ulong)(uint)in_RDI->m_aTeamSize[1]);
      in_RDI->m_UnbalancedTick = -1;
    }
    else {
      str_format(local_108,0x100,"Teams are NOT balanced (red=%d blue=%d)",
                 (ulong)(uint)in_RDI->m_aTeamSize[0],(ulong)(uint)in_RDI->m_aTeamSize[1]);
      if (0x7fffffff < (uint)in_RDI->m_UnbalancedTick) {
        this_00 = Server(in_RDI);
        iVar3 = IServer::Tick(this_00);
        in_RDI->m_UnbalancedTick = iVar3;
      }
    }
    this_01 = GameServer(in_RDI);
    pIVar5 = CGameContext::Console(this_01);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,2,"game",local_108,0);
  }
  else {
    in_RDI->m_UnbalancedTick = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void IGameController::CheckTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime)
	{
		m_UnbalancedTick = TBALANCE_OK;
		return;
	}

	// check if teams are unbalanced
	char aBuf[256];
	if(absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) >= NUM_TEAMS)
	{
		str_format(aBuf, sizeof(aBuf), "Teams are NOT balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		if(m_UnbalancedTick <= TBALANCE_OK)
			m_UnbalancedTick = Server()->Tick();
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "Teams are balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		m_UnbalancedTick = TBALANCE_OK;
	}
	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
}